

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O0

void __thiscall Liby::Connection::Connection(Connection *this,EventLoop *loop,SockPtr *socket)

{
  bool bVar1;
  Poller *pPVar2;
  SockPtr *socket_local;
  EventLoop *loop_local;
  Connection *this_local;
  
  std::enable_shared_from_this<Liby::Connection>::enable_shared_from_this
            (&this->super_enable_shared_from_this<Liby::Connection>);
  TimerMixin::TimerMixin(&this->super_TimerMixin);
  (this->super_TimerMixin)._vptr_TimerMixin = (_func_int **)&PTR__Connection_0018e7e8;
  std::shared_ptr<Liby::BaseContext>::shared_ptr(&this->context_);
  this->destroy_ = false;
  pPVar2 = EventLoop::getPoller(loop);
  this->poller_ = pPVar2;
  this->loop_ = loop;
  std::shared_ptr<Liby::Connection>::shared_ptr(&this->self_);
  std::shared_ptr<Liby::Socket>::shared_ptr(&this->socket_,socket);
  std::shared_ptr<Liby::Channel>::shared_ptr(&this->chan_);
  Buffer::Buffer(&this->readBuf_,0x400);
  std::deque<Liby::io_task,_std::allocator<Liby::io_task>_>::deque(&this->writTasks_);
  std::function<void_(Liby::Connection_&)>::function(&this->readEventCallback_);
  std::function<void_(Liby::Connection_&)>::function(&this->erroEventCallback_);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)socket);
  if (!bVar1) {
    __assert_fail("socket",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Connection.cpp"
                  ,0xc,"Liby::Connection::Connection(EventLoop *, const SockPtr &)");
  }
  return;
}

Assistant:

Connection::Connection(EventLoop *loop, const SockPtr &socket)
    : poller_(loop->getPoller()), loop_(loop), socket_(socket), readBuf_(1024) {
    assert(socket);
}